

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

_Bool Check(DecodeStatus *Out,DecodeStatus In)

{
  DecodeStatus In_local;
  DecodeStatus *Out_local;
  
  if (In == MCDisassembler_Fail) {
    *Out = MCDisassembler_Fail;
    Out_local._7_1_ = false;
  }
  else if (In == MCDisassembler_SoftFail) {
    *Out = MCDisassembler_SoftFail;
    Out_local._7_1_ = true;
  }
  else if (In == MCDisassembler_Success) {
    Out_local._7_1_ = true;
  }
  else {
    Out_local._7_1_ = true;
  }
  return Out_local._7_1_;
}

Assistant:

static bool Check(DecodeStatus *Out, DecodeStatus In)
{
	switch (In) {
		default:	// never reach
			return true;
		case MCDisassembler_Success:
			// Out stays the same.
			return true;
		case MCDisassembler_SoftFail:
			*Out = In;
			return true;
		case MCDisassembler_Fail:
			*Out = In;
			return false;
	}
	// llvm_unreachable("Invalid DecodeStatus!");
}